

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void lyxml_free_elem(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_elem *plVar1;
  lyxml_elem *elem_00;
  
  if (elem == (lyxml_elem *)0x0) {
    return;
  }
  lyxml_free_attrs(ctx,elem);
  elem_00 = elem->child;
  while (elem_00 != (lyxml_elem *)0x0) {
    plVar1 = elem_00->next;
    lyxml_free_elem(ctx,elem_00);
    elem_00 = plVar1;
  }
  lydict_remove(ctx,elem->name);
  lydict_remove(ctx,elem->content);
  free(elem);
  return;
}

Assistant:

static void
lyxml_free_elem(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_elem *e, *next;

    if (!elem) {
        return;
    }

    lyxml_free_attrs(ctx, elem);
    LY_TREE_FOR_SAFE(elem->child, next, e) {
        lyxml_free_elem(ctx, e);
    }
    lydict_remove(ctx, elem->name);
    lydict_remove(ctx, elem->content);
    free(elem);
}